

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

streamsize __thiscall
stream::(anonymous_namespace)::inno_block_filter::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_block_filter *this,linked_streambuf<char,_std::char_traits<char>_> *src,char *dest,
          streamsize n)

{
  long lVar1;
  bool bVar2;
  char *__first;
  long *plVar3;
  long in_RCX;
  long *in_RDI;
  streamsize size;
  streamsize nread;
  linked_streambuf<char,_std::char_traits<char>_> *in_stack_00000080;
  inno_block_filter *in_stack_00000088;
  char *in_stack_ffffffffffffffb0;
  long local_30;
  long local_28 [5];
  
  local_30 = 0;
  local_28[0] = in_RCX;
  while( true ) {
    if (local_28[0] == 0) {
      return local_30;
    }
    if ((*in_RDI == in_RDI[1]) &&
       (bVar2 = read_chunk<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
                          (in_stack_00000088,in_stack_00000080), !bVar2)) break;
    __first = (char *)(in_RDI[1] - *in_RDI);
    plVar3 = std::min<long>(local_28,(long *)&stack0xffffffffffffffc0);
    lVar1 = *plVar3;
    std::copy<char*,char*>(__first,(char *)in_RDI,in_stack_ffffffffffffffb0);
    *in_RDI = lVar1 + *in_RDI;
    local_28[0] = local_28[0] - lVar1;
    local_30 = lVar1 + local_30;
  }
  if (local_30 != 0) {
    return local_30;
  }
  return -1;
}

Assistant:

std::streamsize read(Source & src, char * dest, std::streamsize n) {
		
		std::streamsize nread = 0;
		while(n) {
			
			if(pos == length && !read_chunk(src)) {
				return nread ? nread : EOF;
			}
			
			std::streamsize size = std::min(n, std::streamsize(length - pos));
			
			std::copy(buffer + pos, buffer + pos + size, dest + nread);
			
			pos += size_t(size), n -= size, nread += size;
		}
		
		return nread;
	}